

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O0

bool __thiscall
Js::ES5Array::SetPropertyBuiltIns
          (ES5Array *this,PropertyId propertyId,Var value,
          PropertyOperationFlags propertyOperationFlags,BOOL *result)

{
  uint uVar1;
  uint32 uVar2;
  uint32 uVar3;
  ScriptContext *scriptContext_00;
  DynamicTypeHandler *pDVar4;
  ThreadContext *this_00;
  uint32 assignedLen;
  uint32 newLen;
  ScriptContext *scriptContext;
  BOOL *result_local;
  PropertyOperationFlags propertyOperationFlags_local;
  Var value_local;
  PropertyId propertyId_local;
  ES5Array *this_local;
  
  scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  if (propertyId == 0xd1) {
    pDVar4 = DynamicObject::GetTypeHandler((DynamicObject *)this);
    uVar1 = (*pDVar4->_vptr_DynamicTypeHandler[0x41])();
    if ((uVar1 & 1) == 0) {
      *result = 0;
      this_local._7_1_ = true;
    }
    else {
      uVar2 = ToLengthValue(value,scriptContext_00);
      pDVar4 = DynamicObject::GetTypeHandler((DynamicObject *)this);
      uVar3 = (*pDVar4->_vptr_DynamicTypeHandler[0x42])
                        (pDVar4,this,(ulong)uVar2,(ulong)propertyOperationFlags);
      if (uVar2 != uVar3) {
        this_00 = ScriptContext::GetThreadContext(scriptContext_00);
        ThreadContext::AddImplicitCallFlags(this_00,ImplicitCall_NoOpSet);
      }
      *result = 1;
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ES5Array::SetPropertyBuiltIns(PropertyId propertyId, Var value, PropertyOperationFlags propertyOperationFlags, BOOL* result)
    {
        ScriptContext* scriptContext = GetScriptContext();

        if (propertyId == PropertyIds::length)
        {
            if (!GetTypeHandler()->IsLengthWritable())
            {
                *result = false; // reject
                return true;
            }

            uint32 newLen = ToLengthValue(value, scriptContext);
            uint32 assignedLen = GetTypeHandler()->SetLength(this, newLen, propertyOperationFlags);
            if (newLen != assignedLen)
            {
                scriptContext->GetThreadContext()->AddImplicitCallFlags(ImplicitCall_NoOpSet);
            }
            *result = true;
            return true;
        }

        return false;
    }